

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_tree_builder.h
# Opt level: O0

Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> * __thiscall
bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
          (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *__return_storage_ptr__,
          MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this,
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          *mini_trees)

{
  allocator<unsigned_long> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  ThreadPool *this_01;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  anon_class_16_2_4c4d9b9a __comp;
  size_t dst_node;
  ulong uVar5;
  undefined8 uVar6;
  float fVar7;
  bool bVar8;
  size_type sVar9;
  const_reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  size_type sVar13;
  iterator iVar14;
  iterator iVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  reference pvVar17;
  reference pvVar18;
  size_t sVar19;
  unsigned_long *puVar20;
  Task *task;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_830;
  anon_class_40_5_dabb3477 local_758;
  size_t local_730;
  size_t tree_id;
  Node<float,_3UL,_32UL,_4UL> *node;
  iterator __end0;
  iterator __begin0;
  vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
  *__range3;
  anon_class_16_2_cdc430d5 copy_node;
  size_t i_1;
  size_t prim_count;
  size_t node_count;
  undefined1 local_6d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> prim_offsets;
  undefined1 local_6b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> node_offsets;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_690;
  byte local_679;
  undefined1 local_678 [8];
  Config config;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  ulong local_618;
  size_t i;
  undefined1 local_608 [8];
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  allocator<bvh::v2::Vec<float,_3UL>_> local_5d9;
  undefined1 local_5d8 [8];
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  *mini_trees_local;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *this_local;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> local_578;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_4c0;
  pointer local_4a8;
  size_t local_4a0;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_498;
  undefined8 local_490;
  float local_488;
  anon_class_8_1_8991fb9c local_480;
  undefined8 local_474;
  float local_46c;
  undefined8 local_468;
  float local_460;
  anon_class_8_1_8991fb9c local_458;
  undefined8 local_450;
  float local_448;
  const_reference local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  ulong local_420;
  float local_418;
  anon_class_16_2_94732099 local_410;
  anon_class_8_1_8991fb9c *local_400;
  undefined1 local_3f4 [8];
  Vec<float,_3UL> v;
  anon_class_16_2_94732099 local_3d8;
  anon_class_8_1_8991fb9c *local_3c8;
  undefined1 local_3bc [8];
  Vec<float,_3UL> v_1;
  size_t local_340;
  size_t axis;
  pointer local_328;
  pointer local_318;
  size_t local_310;
  Config *local_308;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_300;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_2f8;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_2e8;
  Config *local_2d8;
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_2d0;
  span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> local_2c8;
  span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL> local_2b8;
  reference local_2a8;
  Index *local_2a0;
  Index *local_298;
  Index *local_290;
  Index *local_288;
  reference local_280;
  reference local_278;
  ulong local_270;
  float local_268;
  ulong local_260;
  float local_258;
  float local_250 [2];
  float local_248;
  Vec<float,_3UL> local_240;
  reference local_230;
  ulong local_228;
  float local_220;
  float local_218 [2];
  float local_210;
  float local_208 [2];
  float local_200;
  anon_class_16_2_94731e0a local_1f8;
  reference local_1e8;
  Vec<float,_3UL> *local_1e0;
  float local_1d8 [2];
  float local_1d0;
  float local_1c8 [2];
  float local_1c0;
  anon_class_16_2_94732099 local_1b8;
  anon_class_16_2_94731e0a *local_1a8;
  undefined1 local_19c [8];
  Vec<float,_3UL> v_2;
  anon_class_16_2_94731e0a local_150;
  float local_13c;
  Vec<float,_3UL> *local_138;
  ulong local_130;
  float local_128;
  ulong local_120;
  float local_118;
  anon_class_16_2_94732099 local_110;
  anon_class_16_2_94731e0a *local_100;
  undefined1 local_f4 [8];
  Vec<float,_3UL> v_3;
  anon_class_56_3_c7f13407 local_b8;
  Task local_78;
  _Manager_type local_58;
  unsigned_long local_50;
  size_t next;
  size_t i_2;
  unsigned_long local_38;
  _Manager_type local_30;
  unsigned_long chunk_size;
  size_type local_20;
  size_t local_18;
  MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *local_10;
  
  centers.super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mini_trees;
  sVar9 = std::
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          ::size(mini_trees);
  std::allocator<bvh::v2::Vec<float,_3UL>_>::allocator(&local_5d9);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_5d8,sVar9,&local_5d9);
  std::allocator<bvh::v2::Vec<float,_3UL>_>::~allocator(&local_5d9);
  sVar9 = std::
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          ::size((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  *)centers.
                    super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<bvh::v2::BBox<float,_3UL>_>::allocator
            ((allocator<bvh::v2::BBox<float,_3UL>_> *)((long)&i + 7));
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            ((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_608,sVar9,(allocator<bvh::v2::BBox<float,_3UL>_> *)((long)&i + 7));
  std::allocator<bvh::v2::BBox<float,_3UL>_>::~allocator
            ((allocator<bvh::v2::BBox<float,_3UL>_> *)((long)&i + 7));
  for (local_618 = 0; uVar5 = local_618,
      sVar9 = std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::size((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      *)centers.
                        super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar5 < sVar9;
      local_618 = local_618 + 1) {
    local_278 = std::
                vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ::operator[]((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                              *)centers.
                                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_618);
    pvVar10 = std::
              vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              ::operator[](&local_278->nodes,0);
    local_410.f = &local_458;
    local_410.v = (Vec<float,_3UL> *)local_3f4;
    v_1.values._4_8_ = &local_410;
    local_458.this = pvVar10;
    local_440 = pvVar10;
    local_400 = local_410.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,0);
    uVar6 = v_1.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_1.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:48:35)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar6,2);
    local_418 = v.values[0];
    local_420 = (ulong)local_3f4;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_3f4;
    local_468 = vmovlpd_avx(auVar4);
    local_460 = v.values[0];
    local_448 = v.values[0];
    local_3d8.f = &local_480;
    local_3d8.v = (Vec<float,_3UL> *)local_3bc;
    local_480.this = pvVar10;
    local_450 = local_468;
    local_3c8 = local_3d8.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_3d8,0);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_3d8,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/node.h:49:35)>
    ::anon_class_16_2_94732099::operator()(&local_3d8,2);
    v.values[1] = (float)local_3bc._0_4_;
    v.values[2] = (float)local_3bc._4_4_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_3bc;
    local_490 = vmovlpd_avx(auVar3);
    local_488 = v_1.values[0];
    local_46c = v_1.values[0];
    local_428 = &local_630;
    local_430 = &local_450;
    local_438 = &local_474;
    local_630 = local_450;
    uStack_628._0_4_ = local_448;
    uStack_620._4_4_ = v_1.values[0];
    local_474 = local_490;
    pvVar11 = std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::
              operator[]((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                          *)local_608,local_618);
    *(undefined8 *)((pvVar11->max).values + 1) = uStack_620;
    *(undefined8 *)(pvVar11->min).values = local_630;
    *(undefined8 *)((pvVar11->min).values + 2) = uStack_628;
    local_230 = std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                ::operator[]((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                              *)local_608,local_618);
    local_1f8.a = &local_230->max;
    local_1b8.f = &local_1f8;
    local_1b8.v = (Vec<float,_3UL> *)local_19c;
    v_2.values._4_8_ = &local_1b8;
    local_1f8.b = &local_230->min;
    local_1e8 = local_230;
    local_1e0 = local_1f8.a;
    local_1a8 = local_1b8.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,0);
    uVar6 = v_2.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_2.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:49:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar6,2);
    local_1c0 = v_2.values[0];
    local_1c8[0] = (float)local_19c._0_4_;
    local_1c8[1] = (float)local_19c._4_4_;
    local_200 = v_2.values[0];
    local_208[0] = (float)local_19c._0_4_;
    local_208[1] = (float)local_19c._4_4_;
    local_1d0 = v_2.values[0];
    local_1d8[0] = (float)local_19c._0_4_;
    local_1d8[1] = (float)local_19c._4_4_;
    local_210 = v_2.values[0];
    local_218[0] = (float)local_19c._0_4_;
    local_218[1] = (float)local_19c._4_4_;
    local_248 = v_2.values[0];
    local_250[0] = (float)local_19c._0_4_;
    local_250[1] = (float)local_19c._4_4_;
    local_240.values[2] = v_2.values[0];
    local_240.values[0] = (float)local_19c._0_4_;
    local_240.values[1] = (float)local_19c._4_4_;
    local_150.a = &local_240;
    local_13c = 0.5;
    local_150.b = &local_13c;
    local_110.f = &local_150;
    local_110.v = (Vec<float,_3UL> *)local_f4;
    v_3.values._4_8_ = &local_110;
    local_138 = local_150.a;
    local_100 = local_110.f;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,0);
    uVar6 = v_3.values._4_8_;
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)v_3.values._4_8_,1);
    Vec<float,_3UL>::
    generate<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/vec.h:74:32)>
    ::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)uVar6,2);
    fVar7 = v_3.values[0];
    local_118 = v_3.values[0];
    local_120 = (ulong)local_f4;
    local_128 = v_3.values[0];
    local_130 = (ulong)local_f4;
    local_258 = v_3.values[0];
    local_260 = (ulong)local_f4;
    local_220 = v_3.values[0];
    local_228 = (ulong)local_f4;
    local_268 = v_3.values[0];
    local_270 = (ulong)local_f4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_f4;
    sVar19 = vmovlpd_avx(auVar2);
    config.max_leaf_size = sVar19;
    pvVar12 = std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::
              operator[]((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          *)local_5d8,local_618);
    *(size_t *)pvVar12->values = sVar19;
    pvVar12->values[2] = fVar7;
  }
  memcpy(local_678,this->config_,0x28);
  config.sah.cost_ratio_ = 1.4013e-45;
  config.sah._20_4_ = 0;
  config.min_leaf_size = 1;
  local_679 = 0;
  std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::
  span<std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>_&>
            (&local_690,
             (vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
             local_608);
  std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::
  span<std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>_&>
            ((span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)
             &node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
             local_5d8);
  local_4a8 = local_690._M_ptr;
  local_4a0 = local_690._M_extent._M_extent_value;
  local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_678;
  local_2e8._M_ptr = local_690._M_ptr;
  local_2e8._M_extent._M_extent_value = local_690._M_extent._M_extent_value;
  local_2f8._M_ptr =
       (pointer)node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_300 = &local_578;
  local_318 = local_690._M_ptr;
  local_310 = local_690._M_extent._M_extent_value;
  local_328 = node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage;
  local_2b8._M_ptr = local_690._M_ptr;
  local_2b8._M_extent._M_extent_value = local_690._M_extent._M_extent_value;
  local_2c8._M_ptr =
       (pointer)node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>._vptr_TopDownSahBuilder =
       (_func_int **)&PTR___cxa_pure_virtual_00180cd8;
  local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_ptr =
       local_690._M_ptr;
  local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.bboxes_._M_extent.
  _M_extent_value = local_690._M_extent._M_extent_value;
  local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.centers_._M_ptr =
       (pointer)node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_498 = __return_storage_ptr__;
  local_308 = (Config *)
              local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2d8 = (Config *)
              local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2d0 = local_300;
  local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>.config_ =
       (Config *)
       local_4c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  sVar9 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_2b8);
  sVar13 = std::span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL>::size(&local_2c8);
  if (sVar9 != sVar13) {
    __assert_fail("bboxes.size() == centers.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                  ,0x3f,
                  "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                 );
  }
  if (local_2d8->max_leaf_size < local_2d8->min_leaf_size) {
    __assert_fail("config.min_leaf_size <= config.max_leaf_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                  ,0x40,
                  "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                 );
  }
  local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>._vptr_TopDownSahBuilder =
       (_func_int **)&PTR_get_prim_ids_00180cf8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_578.marks_);
  std::vector<float,_std::allocator<float>_>::vector(&local_578.accum_);
  local_830 = local_578.prim_ids_;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_830);
    local_830 = local_830 + 1;
  } while (local_830 != &local_4c0);
  sVar9 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_2e8);
  std::vector<bool,_std::allocator<bool>_>::resize(&local_578.marks_,sVar9,false);
  sVar9 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_2e8);
  std::vector<float,_std::allocator<float>_>::resize(&local_578.accum_,sVar9);
  for (local_340 = 0; local_340 < 3; local_340 = local_340 + 1) {
    pvVar1 = local_578.prim_ids_ + local_340;
    sVar9 = std::span<const_bvh::v2::BBox<float,_3UL>,_18446744073709551615UL>::size(&local_2e8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,sVar9);
    iVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (local_578.prim_ids_ + local_340);
    iVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (local_578.prim_ids_ + local_340);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar14._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar15._M_current,0);
    iVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (local_578.prim_ids_ + local_340);
    iVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (local_578.prim_ids_ + local_340);
    __comp.axis = &local_340;
    __comp.centers = &local_2f8;
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar14._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar15._M_current,__comp);
  }
  TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
            (__return_storage_ptr__,
             &local_578.super_TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>);
  SweepSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~SweepSahBuilder(&local_578);
  sVar9 = std::
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          ::size((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  *)centers.
                    super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<unsigned_long> *)
            ((long)&prim_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8,sVar9,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&prim_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar9 = std::
          vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
          ::size((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  *)centers.
                    super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&node_count + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8,sVar9,
             (allocator<unsigned_long> *)((long)&node_count + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&node_count + 7));
  prim_count = std::
               vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ::size(&__return_storage_ptr__->nodes);
  i_1 = 0;
  for (copy_node.node_offsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
      pvVar1 = copy_node.node_offsets,
      pvVar16 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                std::
                vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ::size((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)centers.
                          super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage), pvVar1 < pvVar16;
      copy_node.node_offsets =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((long)&((copy_node.node_offsets)->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1)) {
    pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8,
                         (size_type)copy_node.node_offsets);
    *pvVar17 = prim_count - 1;
    pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8,
                         (size_type)copy_node.node_offsets);
    *pvVar17 = i_1;
    pvVar18 = std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::operator[]((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                            *)centers.
                              super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)copy_node.node_offsets);
    sVar9 = std::
            vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ::size(&pvVar18->nodes);
    prim_count = (sVar9 - 1) + prim_count;
    pvVar18 = std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::operator[]((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                            *)centers.
                              super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)copy_node.node_offsets);
    sVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar18->prim_ids);
    i_1 = sVar9 + i_1;
  }
  __range3 = (vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
              *)local_6d8;
  copy_node.prim_offsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8;
  __end0 = std::
           vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
           ::begin(&__return_storage_ptr__->nodes);
  node = (Node<float,_3UL,_32UL,_4UL> *)
         std::
         vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ::end(&__return_storage_ptr__->nodes);
  do {
    bVar8 = __gnu_cxx::
            operator==<bvh::v2::Node<float,_3UL,_32UL,_4UL>_*,_std::vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      (&__end0,(__normal_iterator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_*,_std::vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                *)&node);
    if (((bVar8 ^ 0xffU) & 1) == 0) {
      std::
      vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
      ::resize(&__return_storage_ptr__->nodes,prim_count);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&__return_storage_ptr__->prim_ids,i_1);
      sVar9 = std::
              vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
              ::size((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      *)centers.
                        super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_758.mini_trees =
           (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
            *)centers.
              super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_758.copy_node = (anon_class_16_2_cdc430d5 *)&__range3;
      local_758.node_offsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8;
      local_758.prim_offsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8;
      local_18 = 0;
      chunk_size = (unsigned_long)&local_758;
      local_758.bvh = __return_storage_ptr__;
      local_20 = sVar9;
      local_10 = this;
      if (sVar9 < (this->executor_).parallel_threshold) {
        build_top_bvh::anon_class_40_5_dabb3477::operator()
                  ((anon_class_40_5_dabb3477 *)chunk_size,0,sVar9);
      }
      else {
        local_38 = 1;
        sVar19 = ThreadPool::get_thread_count((this->executor_).thread_pool);
        i_2 = sVar9 / sVar19;
        task = (Task *)&i_2;
        puVar20 = std::max<unsigned_long>(&local_38,(unsigned_long *)task);
        local_30 = (_Manager_type)*puVar20;
        for (next = local_18; next < local_20; next = (size_t)(local_30 + next)) {
          local_58 = local_30 + next;
          puVar20 = std::min<unsigned_long>(&local_20,(unsigned_long *)&local_58);
          local_b8.next = *puVar20;
          this_01 = (this->executor_).thread_pool;
          local_b8.loop.prim_offsets =
               *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(chunk_size + 0x20);
          local_b8.loop.mini_trees =
               *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                 **)chunk_size;
          local_b8.loop.copy_node = *(anon_class_16_2_cdc430d5 **)(chunk_size + 8);
          local_b8.loop.bvh = *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)(chunk_size + 0x10);
          local_b8.loop.node_offsets =
               *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(chunk_size + 0x18);
          local_b8.i = next;
          local_50 = local_b8.next;
          std::function<void(unsigned_long)>::
          function<bvh::v2::ParallelExecutor::for_each<bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,unsigned_int>::build_top_bvh(std::vector<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>,std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>>>&)::_lambda(unsigned_long,unsigned_long)_1_>(unsigned_long,unsigned_long,bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,unsigned_int>::build_top_bvh(std::vector<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>,std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,3ul,32ul,4ul>>>>&)::_lambda(unsigned_long,unsigned_long)_1_const&)::_lambda(unsigned_long)_1_,void>
                    ((function<void(unsigned_long)> *)&local_78,&local_b8);
          task = &local_78;
          ThreadPool::push(this_01,task);
          std::function<void_(unsigned_long)>::~function(&local_78);
        }
        ThreadPool::wait((this->executor_).thread_pool,task);
      }
      local_679 = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6d8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8);
      if ((local_679 & 1) == 0) {
        Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::~Bvh(__return_storage_ptr__);
      }
      std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::~vector
                ((vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> *)
                 local_608);
      std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::~vector
                ((vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> *)
                 local_5d8);
      return __return_storage_ptr__;
    }
    tree_id = (size_t)__gnu_cxx::
                      __normal_iterator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_*,_std::vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      ::operator*(&__end0);
    local_298 = &((reference)tree_id)->index;
    local_2a8 = (reference)tree_id;
    local_290 = local_298;
    if ((local_298->value & 0xf) != 0) {
      local_288 = &((reference)tree_id)->index;
      if ((local_288->value & 0xf) != 1) {
        __assert_fail("node.index.prim_count() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                      ,0x11d,
                      "Bvh<Node> bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::build_top_bvh(std::vector<Bvh<Node>> &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                     );
      }
      local_2a0 = &((reference)tree_id)->index;
      pvVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&__return_storage_ptr__->prim_ids,(ulong)(local_2a0->value >> 4));
      dst_node = tree_id;
      sVar19 = *pvVar17;
      local_730 = sVar19;
      local_280 = std::
                  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ::operator[]((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                *)centers.
                                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar19);
      pvVar10 = std::
                vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ::operator[](&local_280->nodes,0);
      build_top_bvh::anon_class_16_2_cdc430d5::operator()
                ((anon_class_16_2_cdc430d5 *)&__range3,sVar19,
                 (Node<float,_3UL,_32UL,_4UL> *)dst_node,pvVar10);
    }
    __gnu_cxx::
    __normal_iterator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_*,_std::vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

Bvh<Node> build_top_bvh(std::vector<Bvh<Node>>& mini_trees) {
        // Build a BVH using the mini trees as leaves
        std::vector<Vec> centers(mini_trees.size());
        std::vector<BBox> bboxes(mini_trees.size());
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            bboxes[i] = mini_trees[i].get_root().get_bbox();
            centers[i] = bboxes[i].get_center();
        }

        typename SweepSahBuilder<Node>::Config config = config_;
        config.max_leaf_size = config.min_leaf_size = 1; // Needs to have only one mini-tree in each leaf
        auto bvh = SweepSahBuilder<Node>::build(bboxes, centers, config);

        // Compute the offsets to apply to primitive and node indices
        std::vector<size_t> node_offsets(mini_trees.size());
        std::vector<size_t> prim_offsets(mini_trees.size());
        size_t node_count = bvh.nodes.size();
        size_t prim_count = 0;
        for (size_t i = 0; i < mini_trees.size(); ++i) {
            node_offsets[i] = node_count - 1; // Skip root node
            prim_offsets[i] = prim_count;
            node_count += mini_trees[i].nodes.size() - 1; // idem
            prim_count += mini_trees[i].prim_ids.size();
        }

        // Helper function to copy and fix the child/primitive index of a node
        auto copy_node = [&] (size_t i, Node& dst_node, const Node& src_node) {
            dst_node = src_node;
            dst_node.index.set_first_id(dst_node.index.first_id() +
                (src_node.is_leaf() ? prim_offsets[i] : node_offsets[i]));
        };

        // Make the leaves of the top BVH point to the right internal nodes
        for (auto& node : bvh.nodes) {
            if (!node.is_leaf())
                continue;
            assert(node.index.prim_count() == 1);
            size_t tree_id = bvh.prim_ids[node.index.first_id()];
            copy_node(tree_id, node, mini_trees[tree_id].get_root());
        }

        bvh.nodes.resize(node_count);
        bvh.prim_ids.resize(prim_count);
        executor_.for_each(0, mini_trees.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& mini_tree = mini_trees[i];

                    // Copy the nodes of the mini tree with the offsets applied, without copying
                    // the root node (since it is already copied to the top-level part of the BVH).
                    for (size_t j = 1; j < mini_tree.nodes.size(); ++j)
                        copy_node(i, bvh.nodes[node_offsets[i] + j], mini_tree.nodes[j]);

                    std::copy(
                        mini_tree.prim_ids.begin(),
                        mini_tree.prim_ids.end(),
                        bvh.prim_ids.begin() + prim_offsets[i]);
                }
            });

        return bvh;
    }